

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

bool __thiscall OpenMD::Sphere::isInterior(Sphere *this,Vector3d *pos)

{
  Vector<double,_3U> *in_RDI;
  double dVar1;
  bool result;
  Vector3d r;
  Vector<double,_3U> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  
  OpenMD::operator-((Vector<double,_3U> *)
                    CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),in_RDI);
  Vector3<double>::Vector3((Vector3<double> *)in_RDI,in_stack_ffffffffffffffa8);
  dVar1 = Vector<double,_3U>::length((Vector<double,_3U> *)0x395b4f);
  return dVar1 < in_RDI[2].data_[2];
}

Assistant:

bool Sphere::isInterior(Vector3d pos) {
    Vector3d r = pos - origin_;

    bool result;
    if (r.length() < radius_)
      result = true;
    else
      result = false;

    return result;
  }